

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O3

void __thiscall
CVmObjByteArray::move_bytes
          (CVmObjByteArray *this,unsigned_long dst_idx,unsigned_long src_idx,unsigned_long cnt)

{
  char *pcVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  void *pvVar9;
  ulong uVar10;
  void *local_40;
  
  if (dst_idx < src_idx) {
    if (cnt != 0) {
      pcVar1 = (this->super_CVmObject).ext_;
      uVar7 = dst_idx - 1;
      pvVar9 = (void *)(*(long *)(*(long *)(pcVar1 + (uVar7 >> 0x1c) * 8 + 4) +
                                 (ulong)((uint)(uVar7 >> 0xc) & 0xfff8)) + (uVar7 & 0x7fff));
      uVar4 = 0x8000 - (uVar7 & 0x7fff);
      uVar7 = src_idx - 1;
      uVar8 = 0x8000 - (uVar7 & 0x7fff);
      local_40 = (void *)((uVar7 & 0x7fff) +
                         *(long *)(*(long *)(pcVar1 + (uVar7 >> 0x1c) * 8 + 4) +
                                  (ulong)((uint)(uVar7 >> 0xc) & 0xfff8)));
      uVar7 = uVar8;
      if (cnt < uVar8) {
        uVar7 = cnt;
      }
      if (uVar4 <= uVar7) {
        uVar7 = uVar4;
      }
      memmove(pvVar9,local_40,uVar7);
      uVar3 = cnt - uVar7;
      if (uVar3 != 0) {
        lVar6 = dst_idx + uVar7;
        lVar5 = src_idx + uVar7;
        uVar4 = uVar4 - uVar7;
        pvVar9 = (void *)((long)pvVar9 + uVar7);
        do {
          uVar8 = uVar8 - uVar7;
          if (uVar8 == 0) {
            uVar2 = (uint)(lVar5 - 1U);
            uVar7 = (ulong)(uVar2 & 0x7fff);
            uVar8 = 0x8000 - uVar7;
            local_40 = (void *)(uVar7 + *(long *)(*(long *)((this->super_CVmObject).ext_ +
                                                           (lVar5 - 1U >> 0x1c) * 8 + 4) +
                                                 (ulong)(uVar2 >> 0xc & 0xfff8)));
          }
          else {
            local_40 = (void *)((long)local_40 + uVar7);
          }
          if (uVar4 == 0) {
            uVar2 = (uint)(lVar6 - 1U);
            uVar7 = (ulong)(uVar2 & 0x7fff);
            uVar4 = 0x8000 - uVar7;
            pvVar9 = (void *)(uVar7 + *(long *)(*(long *)((this->super_CVmObject).ext_ +
                                                         (lVar6 - 1U >> 0x1c) * 8 + 4) +
                                               (ulong)(uVar2 >> 0xc & 0xfff8)));
          }
          uVar7 = uVar8;
          if (uVar3 < uVar8) {
            uVar7 = uVar3;
          }
          if (uVar4 <= uVar7) {
            uVar7 = uVar4;
          }
          memmove(pvVar9,local_40,uVar7);
          pvVar9 = (void *)((long)pvVar9 + uVar7);
          uVar4 = uVar4 - uVar7;
          lVar5 = lVar5 + uVar7;
          lVar6 = lVar6 + uVar7;
          uVar3 = uVar3 - uVar7;
        } while (uVar3 != 0);
      }
    }
  }
  else if (cnt != 0) {
    uVar8 = (cnt + dst_idx) - 2;
    uVar3 = (uVar8 | 0xffffffffffff8000) + 0x8001;
    uVar4 = (cnt + src_idx) - 2;
    uVar10 = (uVar4 | 0xffffffffffff8000) + 0x8001;
    pcVar1 = (this->super_CVmObject).ext_;
    uVar7 = uVar10;
    if (cnt < uVar10) {
      uVar7 = cnt;
    }
    if (uVar3 <= uVar7) {
      uVar7 = uVar3;
    }
    local_40 = (void *)((((uVar8 & 0x7fff) +
                         *(long *)(*(long *)(pcVar1 + (uVar8 >> 0x1c) * 8 + 4) +
                                  (ulong)((uint)(uVar8 >> 0xc) & 0xfff8))) - uVar7) + 1);
    pvVar9 = (void *)((((uVar4 & 0x7fff) +
                       *(long *)(*(long *)(pcVar1 + (uVar4 >> 0x1c) * 8 + 4) +
                                (ulong)((uint)(uVar4 >> 0xc) & 0xfff8))) - uVar7) + 1);
    memmove(local_40,pvVar9,uVar7);
    uVar4 = cnt - uVar7;
    if (uVar4 != 0) {
      lVar6 = (dst_idx + cnt) - uVar7;
      lVar5 = (src_idx + cnt) - uVar7;
      uVar3 = uVar3 - uVar7;
      do {
        uVar10 = uVar10 - uVar7;
        if (uVar10 == 0) {
          uVar7 = lVar5 - 2;
          pvVar9 = (void *)(*(long *)(*(long *)((this->super_CVmObject).ext_ +
                                               (uVar7 >> 0x1c) * 8 + 4) +
                                     (ulong)((uint)uVar7 >> 0xc & 0xfff8)) +
                            (ulong)((uint)uVar7 & 0x7fff) + 1);
          uVar10 = (uVar7 | 0xffffffffffff8000) + 0x8001;
        }
        if (uVar3 == 0) {
          uVar7 = lVar6 - 2;
          local_40 = (void *)(*(long *)(*(long *)((this->super_CVmObject).ext_ +
                                                 (uVar7 >> 0x1c) * 8 + 4) +
                                       (ulong)((uint)uVar7 >> 0xc & 0xfff8)) +
                              (ulong)((uint)uVar7 & 0x7fff) + 1);
          uVar3 = (uVar7 | 0xffffffffffff8000) + 0x8001;
        }
        uVar7 = uVar10;
        if (uVar4 < uVar10) {
          uVar7 = uVar4;
        }
        if (uVar3 <= uVar7) {
          uVar7 = uVar3;
        }
        local_40 = (void *)((long)local_40 - uVar7);
        pvVar9 = (void *)((long)pvVar9 - uVar7);
        memmove(local_40,pvVar9,uVar7);
        uVar3 = uVar3 - uVar7;
        lVar5 = lVar5 - uVar7;
        lVar6 = lVar6 - uVar7;
        uVar4 = uVar4 - uVar7;
      } while (uVar4 != 0);
    }
  }
  return;
}

Assistant:

void CVmObjByteArray::move_bytes(unsigned long dst_idx,
                                 unsigned long src_idx,
                                 unsigned long cnt)
{
    size_t src_avail;
    size_t dst_avail;
    unsigned char *srcp;
    unsigned char *dstp;

    /* 
     *   If the destination is before the source, we're moving bytes down,
     *   so we must start at the low end and work forwards through the
     *   array.  If the destination is after the source, we're moving bytes
     *   up, so we must start at the high end and work backwards through the
     *   array.  
     */
    if (dst_idx < src_idx)
    {

        /* 
         *   Moving bytes down in the array - start at the low end and work
         *   forwards through the array.  Get the starting pointers and
         *   available lengths.  
         */
        srcp = get_ele_ptr(src_idx, &src_avail);
        dstp = get_ele_ptr(dst_idx, &dst_avail);

        /* keep going until we've moved all of the bytes requested */
        while (cnt != 0)
        {
            size_t move_len;

            /* 
             *   figure the largest amount we can move - we can move the
             *   smallest of the remaining requested move size, the source
             *   chunk, and the destination chunk 
             */
            move_len = cnt;
            if (move_len > src_avail)
                move_len = src_avail;
            if (move_len > dst_avail)
                move_len = dst_avail;

            /* move the data */
            memmove(dstp, srcp, move_len);

            /* advance all of the counters by the move size */
            srcp += move_len;
            dstp += move_len;
            cnt -= move_len;
            src_avail -= move_len;
            dst_avail -= move_len;
            src_idx += move_len;
            dst_idx += move_len;

            /* stop if we're done */
            if (cnt == 0)
                break;

            /* if the source chunk is at an end, get the next one */
            if (src_avail == 0)
                srcp = get_ele_ptr(src_idx, &src_avail);

            /* if the destination chunk is at an end, get the next one */
            if (dst_avail == 0)
                dstp = get_ele_ptr(dst_idx, &dst_avail);
        }
    }
    else
    {
        /* 
         *   We're to move bytes up in the array - start at the high end and
         *   work backwards through the array.  Advance each index to one
         *   past the last byte of its range.  
         */
        src_idx += cnt;
        dst_idx += cnt;

        /* get the chunk pointers */
        srcp = get_ele_ptr(src_idx - 1, &src_avail) + 1;
        dstp = get_ele_ptr(dst_idx - 1, &dst_avail) + 1;

        /* 
         *   since we're working backwards, we actually want to know the
         *   number of bytes on the page *before* the current pointers, so
         *   subtract the available spaces from the size of the page to get
         *   the available space preceding each 
         */
        src_avail = 32*1024 - src_avail + 1;
        dst_avail = 32*1024 - dst_avail + 1;

        /* keep going until we've moved all of the requested bytes */
        while (cnt != 0)
        {
            size_t move_len;

            /* 
             *   figure the largest amount we can move - we can move the
             *   smallest of the remaining requested move size, the source
             *   chunk, and the destination chunk 
             */
            move_len = cnt;
            if (move_len > src_avail)
                move_len = src_avail;
            if (move_len > dst_avail)
                move_len = dst_avail;

            /* move the data */
            memmove(dstp - move_len, srcp - move_len, move_len);

            /* advance all of the counters by the move size */
            srcp -= move_len;
            dstp -= move_len;
            cnt -= move_len;
            src_avail -= move_len;
            dst_avail -= move_len;
            src_idx -= move_len;
            dst_idx -= move_len;

            /* stop if we're done */
            if (cnt == 0)
                break;

            /* if we've exhausted the source chunk, get the next one */
            if (src_avail == 0)
            {
                srcp = get_ele_ptr(src_idx - 1, &src_avail) + 1;
                src_avail = 32*1024 - src_avail + 1;
            }

            /* if we've exhausted the destination chunk, get the next one */
            if (dst_avail == 0)
            {
                dstp = get_ele_ptr(dst_idx - 1, &dst_avail) + 1;
                dst_avail = 32*1024 - dst_avail + 1;
            }
        }
    }
}